

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-htable.c
# Opt level: O0

void test_empty(void)

{
  int iVar1;
  HTABLE htable;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  HTABLE_CMP_FUNC in_stack_fffffffffffffff0;
  HTABLE_NODE *in_stack_fffffffffffffff8;
  
  memset(&stack0xffffffffffffffe8,0,0x18);
  iVar1 = htable_is_empty((HTABLE *)&stack0xffffffffffffffe8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                 ,0x66,"%s","htable_is_empty(&htable)");
  make_val((char *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  iVar1 = htable_insert((HTABLE *)htable.planes,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
                        (HTABLE_HASH_FUNC)
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                 ,0x67,"%s",
                 "htable_insert(&htable, make_val(\"key\", 42), cmp_func, hash_func) == 0");
  iVar1 = htable_is_empty((HTABLE *)&stack0xffffffffffffffe8);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                 ,0x68,"%s","!htable_is_empty(&htable)");
  htable_fini((HTABLE *)htable.n,(_func_void_HTABLE_NODE_ptr *)htable._8_8_);
  iVar1 = htable_is_empty((HTABLE *)&stack0xffffffffffffffe8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                 ,0x6a,"%s","htable_is_empty(&htable)");
  return;
}

Assistant:

static void
test_empty(void)
{
    HTABLE htable = HTABLE_INITIALIZER;

    TEST_CHECK(htable_is_empty(&htable));
    TEST_CHECK(htable_insert(&htable, make_val("key", 42), cmp_func, hash_func) == 0);
    TEST_CHECK(!htable_is_empty(&htable));
    htable_fini(&htable, dtor_func);
    TEST_CHECK(htable_is_empty(&htable));
}